

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O2

void __thiscall
Position::HandleEnPassant(Position *this,Move *move,Position *position,Square *captureSquare)

{
  Square SVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  SVar1 = move->m_Dest;
  iVar2 = SVar1.j;
  iVar4 = (move->m_Source).j;
  uVar3 = iVar2 - iVar4;
  uVar5 = -uVar3;
  if (0 < (int)uVar3) {
    uVar5 = uVar3;
  }
  if (1 < uVar5) {
    this->m_sEnPassant =
         (Square)((ulong)move->m_Source & 0xffffffff |
                 (ulong)(uint)(((int)uVar3 >> 1) + iVar4) << 0x20);
    return;
  }
  if (((position->m_sEnPassant).i == SVar1.i) && ((position->m_sEnPassant).j == iVar2)) {
    *captureSquare =
         (Square)((ulong)SVar1 & 0xffffffff |
                 (ulong)((-(uint)position->m_ColorToMove | 1) + iVar2) << 0x20);
    CaptureMaterial(this,position,captureSquare);
    (**(this->m_Board).super_BoardPieceSquare.super_BoardHashing.super_BoardBase._vptr_BoardBase)
              (&this->m_Board,(ulong)(uint)(captureSquare->j * 8 + captureSquare->i),&None);
    return;
  }
  CaptureMaterial(this,position,captureSquare);
  return;
}

Assistant:

void HandleEnPassant( const Move &move, const Position &position,
                          Square &captureSquare )
    {
        /* Did the pawn just move two spaces?  If so, record this fact in the position */
        int pawnMoveDistance;
        pawnMoveDistance = move.Dest().J() - move.Source().J();

        if ( abs( pawnMoveDistance ) > 1 )
        {
            /* Halfway between the start and the end */
            pawnMoveDistance = pawnMoveDistance >> 1;
            Square enPassant( move.Source().I(), move.Source().J() + pawnMoveDistance );
            m_sEnPassant = enPassant;
        }

        /* Did the pawn just move into the previous en passant square?  If so, capture */
        else if ( move.Dest() == position.m_sEnPassant )
        {
            /* Capture the pawn behind it */
            int d = position.GetColorToMove() ? -1 : 1;
            captureSquare = Square( move.Dest().I(), move.Dest().J() + d );
            /* FIXME This line doesn't seem to get the material right in the case of an en passant */
            CaptureMaterial( position, captureSquare );
            m_Board.Set( captureSquare.I(), captureSquare.J(), &None );
        }
        else
        {
            /* Not en passant.  Regardless of whether there's a capture or not,
            * bump the material score by the captured square
            */
            CaptureMaterial( position, captureSquare );
        }
    }